

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.c
# Opt level: O2

int ksplit_core(char *s,int delimiter,int *_max,int **_offsets)

{
  ushort uVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  ushort **ppuVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int *local_68;
  
  iVar2 = *_max;
  local_68 = *_offsets;
  sVar3 = strlen(s);
  uVar9 = 0;
  iVar8 = 0;
  uVar7 = 0;
  iVar6 = 0;
  do {
    if ((long)(int)sVar3 < (long)uVar9) {
      *_max = iVar2;
LAB_001360dd:
      *_offsets = local_68;
      return iVar6;
    }
    piVar4 = local_68;
    if (delimiter == 0) {
      ppuVar5 = __ctype_b_loc();
      uVar1 = (*ppuVar5)[iVar8];
      if (((long)s[uVar9] == 0) || (((*ppuVar5)[s[uVar9]] & 0x2000) != 0)) {
        if ((short)uVar1 < 0) {
          s[uVar9] = '\0';
          if (iVar6 == iVar2) {
            iVar8 = iVar2 * 2;
            if (iVar2 == 0) {
              iVar8 = 2;
            }
            piVar4 = (int *)realloc(local_68,(long)iVar8 << 2);
            iVar2 = iVar8;
            if (piVar4 == (int *)0x0) goto LAB_001360fa;
          }
          piVar4[iVar6] = (int)uVar7;
          goto LAB_001360b7;
        }
      }
      else {
        if (iVar8 == 0) {
          uVar7 = uVar9 & 0xffffffff;
        }
        if ((uVar1 & 0x2000) != 0) {
          uVar7 = uVar9 & 0xffffffff;
        }
      }
    }
    else if (s[uVar9] == '\0' || s[uVar9] == delimiter) {
      if (iVar8 != delimiter && iVar8 != 0) {
        s[uVar9] = '\0';
        if (iVar6 == iVar2) {
          iVar8 = iVar2 * 2;
          if (iVar2 == 0) {
            iVar8 = 2;
          }
          piVar4 = (int *)realloc(local_68,(long)iVar8 << 2);
          iVar2 = iVar8;
          if (piVar4 == (int *)0x0) {
LAB_001360fa:
            free(local_68);
            local_68 = (int *)0x0;
            iVar6 = 0;
            goto LAB_001360dd;
          }
        }
        piVar4[iVar6] = (int)uVar7;
LAB_001360b7:
        iVar6 = iVar6 + 1;
        local_68 = piVar4;
      }
    }
    else {
      if (iVar8 == 0) {
        uVar7 = uVar9 & 0xffffffff;
      }
      if (iVar8 == delimiter) {
        uVar7 = uVar9 & 0xffffffff;
      }
    }
    iVar8 = (int)s[uVar9];
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

int ksplit_core(char *s, int delimiter, int *_max, int **_offsets)
{
	int i, n, max, last_char, last_start, *offsets, l;
	n = 0; max = *_max; offsets = *_offsets;
	l = strlen(s);
	
#define __ksplit_aux do {						\
		if (_offsets) {						\
			s[i] = 0;					\
			if (n == max) {					\
				int *tmp;				\
				max = max? max<<1 : 2;			\
				if ((tmp = (int*)realloc(offsets, sizeof(int) * max))) {  \
					offsets = tmp;			\
				} else	{				\
					free(offsets);			\
					*_offsets = NULL;		\
					return 0;			\
				}					\
			}						\
			offsets[n++] = last_start;			\
		} else ++n;						\
	} while (0)

	for (i = 0, last_char = last_start = 0; i <= l; ++i) {
		if (delimiter == 0) {
			if (isspace(s[i]) || s[i] == 0) {
				if (isgraph(last_char)) __ksplit_aux; // the end of a field
			} else {
				if (isspace(last_char) || last_char == 0) last_start = i;
			}
		} else {
			if (s[i] == delimiter || s[i] == 0) {
				if (last_char != 0 && last_char != delimiter) __ksplit_aux; // the end of a field
			} else {
				if (last_char == delimiter || last_char == 0) last_start = i;
			}
		}
		last_char = s[i];
	}
	*_max = max; *_offsets = offsets;
	return n;
}